

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

void jsgf_set_search_path(jsgf_t *jsgf,char *filename)

{
  char *pcVar1;
  char *pcVar2;
  glist_t pgVar3;
  
  pcVar1 = getenv("JSGF_PATH");
  if (pcVar1 == (char *)0x0) {
    if (filename == (char *)0x0) {
      pgVar3 = jsgf->searchpath;
      pcVar1 = __ckd_salloc__(".",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                              ,0x33a);
    }
    else {
      pcVar1 = __ckd_salloc__(filename,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                              ,0x33e);
      path2dirname(filename,pcVar1);
      pgVar3 = jsgf->searchpath;
    }
    pgVar3 = glist_add_ptr(pgVar3,pcVar1);
  }
  else {
    pcVar1 = __ckd_salloc__(pcVar1,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                            ,0x32c);
    while( true ) {
      pcVar2 = strchr(pcVar1,0x3a);
      if (pcVar2 == (char *)0x0) break;
      *pcVar2 = '\0';
      pgVar3 = glist_add_ptr(jsgf->searchpath,pcVar1);
      jsgf->searchpath = pgVar3;
      pcVar1 = pcVar2 + 1;
    }
    pgVar3 = glist_add_ptr(jsgf->searchpath,pcVar1);
    jsgf->searchpath = pgVar3;
    pgVar3 = glist_reverse(pgVar3);
  }
  jsgf->searchpath = pgVar3;
  return;
}

Assistant:

static void
jsgf_set_search_path(jsgf_t * jsgf, const char *filename)
{
    char *jsgf_path;

#if !defined(_WIN32_WCE)
    if ((jsgf_path = getenv("JSGF_PATH")) != NULL) {
        char *word, *c;
        word = jsgf_path = ckd_salloc(jsgf_path);
        while ((c = strchr(word, ':'))) {
            *c = '\0';
            jsgf->searchpath = glist_add_ptr(jsgf->searchpath, word);
            word = c + 1;
        }
        jsgf->searchpath = glist_add_ptr(jsgf->searchpath, word);
        jsgf->searchpath = glist_reverse(jsgf->searchpath);
        return;
    }
#endif

    if (!filename) {
        jsgf->searchpath =
            glist_add_ptr(jsgf->searchpath, ckd_salloc("."));
        return;
    }

    jsgf_path = ckd_salloc(filename);
    path2dirname(filename, jsgf_path);
    jsgf->searchpath = glist_add_ptr(jsgf->searchpath, jsgf_path);
}